

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
rlib::midi::Smf::getFileImage
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,Smf *this)

{
  _List_node_base **pp_Var1;
  undefined1 uVar2;
  size_t sVar3;
  _Rb_tree_node_base *p_Var4;
  long lVar5;
  long lVar6;
  _List_node_base *p_Var7;
  undefined1 *puVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Rb_tree_const_iterator<rlib::midi::Smf::Event> __tmp;
  _List_node_base *p_Var9;
  undefined1 auVar10 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  size_t position;
  Event e;
  list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  trackData;
  anon_class_16_2_cffccc38 fEvent;
  undefined1 local_d9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  pointer local_a0;
  undefined1 local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  size_t local_88;
  Event local_80;
  _List_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_68;
  Smf *local_50;
  _List_node_base *local_48;
  anon_class_16_2_cffccc38 local_40;
  
  local_68._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
  local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
  local_68._M_impl._M_node._M_size = 0;
  local_50 = this;
  p_Var9 = (this->tracks).
           super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  local_48 = (_List_node_base *)&this->tracks;
  if (p_Var9 != (_List_node_base *)&this->tracks) {
    do {
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88 = 0;
      local_40.position = &local_88;
      local_40.v = &local_d8;
      pp_Var1 = &p_Var9[1]._M_prev;
      for (p_Var4 = (_Rb_tree_node_base *)p_Var9[2]._M_prev; p_Var4 != (_Rb_tree_node_base *)pp_Var1
          ; p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        getFileImage::anon_class_16_2_cffccc38::operator()(&local_40,(Event *)(p_Var4 + 1));
      }
      if ((_List_node_base *)pp_Var1 == p_Var9[2]._M_prev) {
LAB_001539dc:
        sVar3 = local_88;
        local_c0._0_8_ = &PTR__EventMeta_0017b828;
        local_c0._8_2_ = endOfTrack;
        local_c0._10_2_ = sequenceNo >> 0x10;
        local_a0 = (pointer)0x0;
        local_b0 = (undefined1  [16])0x0;
        local_98 = (undefined1  [8])0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<rlib::midi::EventMeta,std::allocator<rlib::midi::EventMeta>,rlib::midi::EventMeta>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8),
                   (EventMeta **)local_98,(allocator<rlib::midi::EventMeta> *)&local_d9,
                   (EventMeta *)local_c0);
        local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Stack_90._M_pi;
        local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_98;
        _local_98 = (undefined1  [16])0x0;
        local_80.position = sVar3;
        if (local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_80.event.
                  super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_80.event.
                  super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80.event.
                     super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
        }
        local_c0._0_8_ = &PTR__EventMeta_0017b828;
        if ((pointer)local_b0._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_b0._0_8_,(long)local_a0 - local_b0._0_8_);
        }
        getFileImage::anon_class_16_2_cffccc38::operator()(&local_40,&local_80);
        this_00._M_pi =
             local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
      else {
        lVar5 = std::_Rb_tree_decrement((_Rb_tree_node_base *)pp_Var1);
        if (*(long *)(lVar5 + 0x28) == 0) {
          lVar6 = 0;
        }
        else {
          lVar6 = __dynamic_cast(*(long *)(lVar5 + 0x28),&Event::typeinfo,&EventMeta::typeinfo,0);
        }
        if (lVar6 == 0) {
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          lVar6 = 0;
        }
        else {
          this_00._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x30);
          if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            }
          }
        }
        if ((lVar6 == 0) || (*(int *)(lVar6 + 8) != 0x2f)) {
          if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
          }
          goto LAB_001539dc;
        }
      }
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      local_c0._4_4_ =
           (int)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
           (int)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_c0._0_4_ = 0x6b72544d;
      lVar5 = 4;
      puVar8 = local_c0 + 7;
      do {
        uVar2 = local_c0[lVar5];
        local_c0[lVar5] = *puVar8;
        *puVar8 = uVar2;
        puVar8 = puVar8 + -1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 6);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_d8,
                 local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,local_c0,local_c0 + 8);
      p_Var7 = (_List_node_base *)operator_new(0x28);
      p_Var7[1]._M_next =
           (_List_node_base *)
           local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      p_Var7[1]._M_prev =
           (_List_node_base *)
           local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      p_Var7[2]._M_next =
           (_List_node_base *)
           local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      local_68._M_impl._M_node._M_size = local_68._M_impl._M_node._M_size + 1;
      if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      p_Var9 = p_Var9->_M_next;
    } while (p_Var9 != local_48);
  }
  puVar8 = local_c0 + 7;
  local_c0._0_8_ = (_func_int **)0x66468544d;
  local_c0._10_2_ = (undefined2)local_68._M_impl._M_node._M_size;
  local_c0._8_2_ = CONCAT11(0,(local_68._M_impl._M_node._M_size & 0xfffe) != 0);
  local_c0._12_2_ = (undefined2)local_50->timeBase;
  lVar5 = 4;
  do {
    uVar2 = local_c0[lVar5];
    local_c0[lVar5] = *puVar8;
    *puVar8 = uVar2;
    puVar8 = puVar8 + -1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  auVar10._2_2_ = local_c0._10_2_;
  auVar10._0_2_ = local_c0._8_2_;
  auVar10._4_2_ = local_c0._12_2_;
  auVar10._6_2_ = local_c0._14_2_;
  auVar10._8_8_ = 0;
  auVar10 = psllw(auVar10,8);
  local_80.position = 0x66468544d;
  local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(CONCAT22(local_80.event.
                         super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._6_2_,local_c0._12_2_ << 8 | (ushort)local_c0._12_2_ >> 8),
                auVar10._0_4_ | (uint)((ushort)local_c0._10_2_ >> 8) << 0x10);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (uchar *)&local_80,
             (uchar *)((long)&local_80.event.
                              super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 6),(allocator_type *)local_c0);
  p_Var9 = (_List_node_base *)&local_68;
  while (p_Var9 = (((_List_impl *)&p_Var9->_M_next)->_M_node).super__List_node_base._M_next,
        p_Var9 != (_List_node_base *)&local_68) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,p_Var9[1]._M_next,p_Var9[1]._M_prev);
  }
  std::__cxx11::
  _List_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::_M_clear(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Smf::getFileImage() const
{
	std::list<std::vector<uint8_t>> trackData;

	for (auto& track : tracks) {
		std::vector<uint8_t> v;

		size_t position = 0;		// 現在位置

		auto fEvent = [&](const Event& event) {

			{// DeltaTime
				assert(event.position >= position);
				const size_t deltaTime = event.position - position;		// DeltaTime
				position = event.position;								// 現在位置更新
				std::vector<uint8_t> s = midi::inner::getVariableValue(deltaTime);
				v.insert(v.end(), std::make_move_iterator(s.begin()), std::make_move_iterator(s.end()));
			}

			{
				std::vector<uint8_t> t = event.event->midiMessage();
				v.insert(v.end(), std::make_move_iterator(t.begin()), std::make_move_iterator(t.end()));
			}

		};

		for (auto& event : track.events) {
			fEvent(event);
		}

		// EndOfTrackがなければ付ける
		[&] {
			if (auto i = track.events.rbegin(); i != track.events.rend()) {		// 末尾が EndOfTrack ではないなら
				if (auto meta = std::dynamic_pointer_cast<const midi::EventMeta>(i->event)) {
					if (meta->type == midi::EventMeta::Type::endOfTrack) {
						return;
					}
				}
			}
			Event e(position, std::make_shared<midi::EventMeta>(midi::EventMeta::createEndOfTrack()));
			fEvent(e);
		}();

		{// TrackChunk を先頭に挿入
			Inner::TrackChunk trackChunk;
			trackChunk.dataLength = static_cast<uint32_t>(v.size());
			Inner::changeEndian(trackChunk.dataLength);
			v.insert(v.begin(),
				reinterpret_cast<const uint8_t*>(&trackChunk),
				reinterpret_cast<const uint8_t*>(&trackChunk) + sizeof(trackChunk));
		}

		trackData.emplace_back(std::move(v));
	}

	const Inner::HeaderChunk headerChunk = [&] {
		Inner::HeaderChunk h;
		h.trackCount = static_cast<uint16_t>(trackData.size());
		h.format = h.trackCount > 1 ? 1 : 0;
		h.division = timeBase;
		// エンディアン変更
		Inner::changeEndian(h.dataLength);
		Inner::changeEndian(h.format);
		Inner::changeEndian(h.trackCount);
		Inner::changeEndian(h.division);
		return h;
	}();

	std::vector<uint8_t> result(
		reinterpret_cast<const uint8_t*>(&headerChunk),
		reinterpret_cast<const uint8_t*>(&headerChunk) + sizeof(headerChunk));

	for (auto& i : trackData) {
		result.insert(result.end(), std::make_move_iterator(i.begin()), std::make_move_iterator(i.end()));
	}

	return result;
}